

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalNinjaGenerator::WriteBuiltinTargets(cmGlobalNinjaGenerator *this,ostream *os)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  pointer pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# =============================================================================\n",
             0x50);
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Built-in targets\n\n",0x14);
  WriteTargetRebuildManifest(this,os);
  WriteTargetClean(this,os);
  WriteTargetHelp(this,os);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            (&local_30,
             (cmMakefile *)
             (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
               super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
             IncludeEmptyConfig);
  for (pbVar2 = local_30.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != local_30.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x42])(this,pbVar2);
    WriteTargetDefault(this,(ostream *)CONCAT44(extraout_var,iVar1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  if ((this->DefaultFileConfig)._M_string_length != 0) {
    iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x43])(this);
    WriteTargetDefault(this,(ostream *)CONCAT44(extraout_var_00,iVar1));
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteBuiltinTargets(std::ostream& os)
{
  // Write headers.
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Built-in targets\n\n";

  this->WriteTargetRebuildManifest(os);
  this->WriteTargetClean(os);
  this->WriteTargetHelp(os);

  for (auto const& config : this->Makefiles[0]->GetGeneratorConfigs(
         cmMakefile::IncludeEmptyConfig)) {
    this->WriteTargetDefault(*this->GetConfigFileStream(config));
  }

  if (!this->DefaultFileConfig.empty()) {
    this->WriteTargetDefault(*this->GetDefaultFileStream());
  }
}